

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

CFG * wasm::analysis::CFG::fromFunction(CFG *__return_storage_ptr__,Function *func)

{
  allocator<wasm::analysis::BasicBlock> *this;
  pointer __n;
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  mapped_type *ppBVar4;
  type __x;
  size_type sVar5;
  reference ppBVar6;
  BasicBlock *local_338;
  BasicBlock *oldSucc;
  iterator __end3_1;
  iterator __begin3_1;
  vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
  *__range3_1;
  BasicBlock *oldPred;
  iterator __end3;
  iterator __begin3;
  vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
  *__range3;
  value_type *newBlock;
  BasicBlock *oldBlock;
  size_t i_1;
  pointer local_2d8;
  size_t i;
  unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
  oldToNewBlocks;
  vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_> local_290;
  undefined1 local_278 [8];
  CFG cfg;
  size_t numBlocks;
  undefined1 local_248 [8];
  CFGBuilder builder;
  Function *func_local;
  
  builder.
  super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  .debugIds._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)func;
  fromFunction::CFGBuilder::CFGBuilder((CFGBuilder *)local_248);
  Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_>::walkFunction
            ((Walker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>_> *)local_248,
             (Function *)
             builder.
             super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
             .debugIds._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfg.blocks.
  super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                vector<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
                ::size((vector<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
                        *)&builder.
                           super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                           .exit);
  CFG((CFG *)local_278);
  __n = cfg.blocks.
        super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage;
  this = (allocator<wasm::analysis::BasicBlock> *)((long)&oldToNewBlocks._M_h._M_single_bucket + 7);
  std::allocator<wasm::analysis::BasicBlock>::allocator(this);
  std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>::vector
            (&local_290,(size_type)__n,this);
  std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>::operator=
            ((vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_> *)
             local_278,&local_290);
  std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>::~vector
            (&local_290);
  std::allocator<wasm::analysis::BasicBlock>::~allocator
            ((allocator<wasm::analysis::BasicBlock> *)
             ((long)&oldToNewBlocks._M_h._M_single_bucket + 7));
  std::
  unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
  ::unordered_map((unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
                   *)&i);
  for (local_2d8 = (pointer)0x0;
      local_2d8 <
      cfg.blocks.
      super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_2d8 = (pointer)((long)&local_2d8->index + 1)) {
    pvVar2 = std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>::
             operator[]((vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>
                         *)local_278,(size_type)local_2d8);
    pvVar3 = std::
             vector<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
             ::operator[]((vector<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
                           *)&builder.
                              super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                              .exit,(size_type)local_2d8);
    i_1 = (size_t)std::
                  unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>
                  ::get(pvVar3);
    ppBVar4 = std::
              unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
              ::operator[]((unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
                            *)&i,(key_type *)&i_1);
    *ppBVar4 = pvVar2;
  }
  for (oldBlock = (BasicBlock *)0x0;
      oldBlock <
      cfg.blocks.
      super__Vector_base<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage;
      oldBlock = (BasicBlock *)
                 ((long)&(oldBlock->contents).
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1)) {
    pvVar3 = std::
             vector<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
             ::operator[]((vector<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
                           *)&builder.
                              super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                              .exit,(size_type)oldBlock);
    __x = std::
          unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>
          ::operator*(pvVar3);
    pvVar2 = std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>::
             operator[]((vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>
                         *)local_278,(size_type)oldBlock);
    pvVar2->index = (Index)oldBlock;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator=
              (&pvVar2->insts,&__x->contents);
    sVar5 = std::
            vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
            ::size(&__x->in);
    std::
    vector<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
    ::reserve(&pvVar2->predecessors,sVar5);
    __end3 = std::
             vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
             ::begin(&__x->in);
    oldPred = (BasicBlock *)
              std::
              vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
              ::end(&__x->in);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_**,_std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>_>
                                  *)&oldPred);
      if (!bVar1) break;
      ppBVar6 = __gnu_cxx::
                __normal_iterator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_**,_std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>_>
                ::operator*(&__end3);
      __range3_1 = (vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
                    *)*ppBVar6;
      ppBVar4 = std::
                unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
                ::at((unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
                      *)&i,(key_type *)&__range3_1);
      std::
      vector<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
      ::push_back(&pvVar2->predecessors,ppBVar4);
      __gnu_cxx::
      __normal_iterator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_**,_std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>_>
      ::operator++(&__end3);
    }
    sVar5 = std::
            vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
            ::size(&__x->out);
    std::
    vector<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
    ::reserve(&pvVar2->successors,sVar5);
    __end3_1 = std::
               vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
               ::begin(&__x->out);
    oldSucc = (BasicBlock *)
              std::
              vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
              ::end(&__x->out);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3_1,
                         (__normal_iterator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_**,_std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>_>
                          *)&oldSucc);
      if (!bVar1) break;
      ppBVar6 = __gnu_cxx::
                __normal_iterator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_**,_std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>_>
                ::operator*(&__end3_1);
      local_338 = *ppBVar6;
      ppBVar4 = std::
                unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
                ::at((unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
                      *)&i,&local_338);
      std::
      vector<const_wasm::analysis::BasicBlock_*,_std::allocator<const_wasm::analysis::BasicBlock_*>_>
      ::push_back(&pvVar2->successors,ppBVar4);
      __gnu_cxx::
      __normal_iterator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_**,_std::vector<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>_>
      ::operator++(&__end3_1);
    }
  }
  bVar1 = std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>::
          empty((vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_> *)
                local_278);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!cfg.blocks.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/cfg.cpp"
                  ,0x41,"static CFG wasm::analysis::CFG::fromFunction(Function *)");
  }
  pvVar2 = std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>::
           operator[]((vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>
                       *)local_278,0);
  pvVar2->entry = true;
  if (builder.
      super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
      .entry != (BasicBlock *)0x0) {
    ppBVar4 = std::
              unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
              ::at((unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
                    *)&i,&builder.
                          super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                          .entry);
    (*ppBVar4)->exit = true;
  }
  CFG(__return_storage_ptr__,(CFG *)local_278);
  std::
  unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
  ::~unordered_map((unordered_map<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_wasm::analysis::BasicBlock_*,_std::hash<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*const,_wasm::analysis::BasicBlock_*>_>_>
                    *)&i);
  ~CFG((CFG *)local_278);
  fromFunction::CFGBuilder::~CFGBuilder((CFGBuilder *)local_248);
  return __return_storage_ptr__;
}

Assistant:

CFG CFG::fromFunction(Function* func) {
  struct CFGBuilder : CFGWalker<CFGBuilder,
                                UnifiedExpressionVisitor<CFGBuilder>,
                                std::vector<Expression*>> {
    void visitExpression(Expression* curr) {
      if (currBasicBlock) {
        currBasicBlock->contents.push_back(curr);
      }
    }
  };

  CFGBuilder builder;
  builder.walkFunction(func);

  size_t numBlocks = builder.basicBlocks.size();

  CFG cfg;
  cfg.blocks = std::vector<BasicBlock>(numBlocks);

  // From here the addresses of the new basic blocks are stable.
  std::unordered_map<CFGBuilder::BasicBlock*, BasicBlock*> oldToNewBlocks;
  for (size_t i = 0; i < numBlocks; ++i) {
    oldToNewBlocks[builder.basicBlocks[i].get()] = &cfg.blocks[i];
  }

  for (size_t i = 0; i < numBlocks; ++i) {
    auto& oldBlock = *builder.basicBlocks[i];
    auto& newBlock = cfg.blocks[i];
    newBlock.index = i;
    newBlock.insts = std::move(oldBlock.contents);
    newBlock.predecessors.reserve(oldBlock.in.size());
    for (auto* oldPred : oldBlock.in) {
      newBlock.predecessors.push_back(oldToNewBlocks.at(oldPred));
    }
    newBlock.successors.reserve(oldBlock.out.size());
    for (auto* oldSucc : oldBlock.out) {
      newBlock.successors.push_back(oldToNewBlocks.at(oldSucc));
    }
  }

  assert(!cfg.blocks.empty());
  cfg.blocks[0].entry = true;
  if (builder.exit) {
    oldToNewBlocks.at(builder.exit)->exit = true;
  }

  // Move-construct a new CFG to get mandatory copy elision, preserving basic
  // block addresses through the return.
  return CFG(std::move(cfg));
}